

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void __thiscall
el::base::TypedConfigurations::build(TypedConfigurations *this,Configurations *configurations)

{
  bool bVar1;
  ConfigurationType CVar2;
  Level LVar3;
  string *psVar4;
  undefined1 extraout_var;
  unsigned_long uVar5;
  reference ppCVar6;
  reference ppCVar7;
  long *in_RSI;
  long *in_RDI;
  iterator conf_2;
  Configuration *conf_1;
  const_iterator it_1;
  unsigned_long v;
  Configuration *conf;
  const_iterator it;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> withFileSizeLimit;
  anon_class_1_0_00000001 getBool;
  ScopedLock scopedLock;
  undefined4 in_stack_fffffffffffffc18;
  int in_stack_fffffffffffffc1c;
  LogFormat *in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc2c;
  string *in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc48;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc50;
  string *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc60;
  Level in_stack_fffffffffffffc64;
  string *in_stack_fffffffffffffc78;
  Level in_stack_fffffffffffffc84;
  TypedConfigurations *in_stack_fffffffffffffc88;
  ConfigurationType in_stack_fffffffffffffc94;
  unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
  *in_stack_fffffffffffffc98;
  string *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca8;
  Level in_stack_fffffffffffffcac;
  TypedConfigurations *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  TypedConfigurations *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  Level in_stack_fffffffffffffccc;
  Level in_stack_fffffffffffffcd0;
  Level in_stack_fffffffffffffcdc;
  TypedConfigurations *in_stack_fffffffffffffce0;
  undefined1 local_2c8 [48];
  Configuration *local_298;
  size_type local_290;
  undefined1 local_288 [16];
  string local_278 [32];
  string_t *local_258;
  unsigned_long local_250;
  string local_248 [32];
  unsigned_long local_228;
  string local_220 [39];
  undefined1 local_1f9;
  string local_1f8 [47];
  undefined1 local_1c9 [16];
  undefined1 includeGlobalLevel;
  unordered_map<el::Level,_el::base::LogFormat,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
  *in_stack_fffffffffffffe48;
  LogFormat *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  Level in_stack_fffffffffffffe5c;
  TypedConfigurations *in_stack_fffffffffffffe60;
  undefined1 local_b9;
  string local_b8 [39];
  undefined1 local_91;
  string local_90 [39];
  undefined1 local_69;
  Configuration *local_68;
  undefined8 local_60;
  undefined8 local_48;
  __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
  local_40 [5];
  NoScopedLock<el::base::threading::internal::NoMutex> local_18;
  long *local_10;
  
  local_10 = in_RSI;
  (**(code **)(*in_RDI + 0x10))();
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)in_stack_fffffffffffffc20,
             (NoMutex *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  utils::std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::vector
            ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)0x22ccad);
  local_48 = (**(code **)(*local_10 + 0x28))();
  __gnu_cxx::
  __normal_iterator<el::Configuration*const*,std::vector<el::Configuration*,std::allocator<el::Configuration*>>>
  ::__normal_iterator<el::Configuration**>
            ((__normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              *)in_stack_fffffffffffffc20,
             (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  while( true ) {
    local_60 = (**(code **)(*local_10 + 0x30))();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)in_stack_fffffffffffffc20,
                       (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    if (!bVar1) break;
    ppCVar6 = __gnu_cxx::
              __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ::operator*(local_40);
    local_68 = *ppCVar6;
    CVar2 = Configuration::configurationType(local_68);
    if (CVar2 == Enabled) {
      Configuration::level(local_68);
      psVar4 = Configuration::value_abi_cxx11_(local_68);
      std::__cxx11::string::string(local_90,(string *)psVar4);
      local_69 = build::anon_class_1_0_00000001::operator()
                           ((anon_class_1_0_00000001 *)in_stack_fffffffffffffc30,
                            (string *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28))
      ;
      setValue<bool>(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                     (bool *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                     SUB41(in_stack_fffffffffffffc94 >> 0x18,0));
      std::__cxx11::string::~string(local_90);
    }
    else {
      CVar2 = Configuration::configurationType(local_68);
      if (CVar2 == ToFile) {
        Configuration::level(local_68);
        psVar4 = Configuration::value_abi_cxx11_(local_68);
        std::__cxx11::string::string(local_b8,(string *)psVar4);
        local_91 = build::anon_class_1_0_00000001::operator()
                             ((anon_class_1_0_00000001 *)in_stack_fffffffffffffc30,
                              (string *)
                              CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
        setValue<bool>(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                       (bool *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                       SUB41(in_stack_fffffffffffffc94 >> 0x18,0));
        std::__cxx11::string::~string(local_b8);
      }
      else {
        CVar2 = Configuration::configurationType(local_68);
        if (CVar2 == ToStandardOutput) {
          Configuration::level(local_68);
          in_stack_fffffffffffffce0 =
               (TypedConfigurations *)Configuration::value_abi_cxx11_(local_68);
          std::__cxx11::string::string
                    ((string *)&stack0xffffffffffffff20,(string *)in_stack_fffffffffffffce0);
          local_b9 = build::anon_class_1_0_00000001::operator()
                               ((anon_class_1_0_00000001 *)in_stack_fffffffffffffc30,
                                (string *)
                                CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
          in_stack_fffffffffffffcdc = CONCAT13(local_b9,(int3)in_stack_fffffffffffffcdc);
          setValue<bool>(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                         (bool *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                         SUB41(in_stack_fffffffffffffc94 >> 0x18,0));
          std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
        }
        else {
          CVar2 = Configuration::configurationType(local_68);
          if (CVar2 != Filename) {
            CVar2 = Configuration::configurationType(local_68);
            if (CVar2 == Format) {
              in_stack_fffffffffffffcd0 = Configuration::level(local_68);
              in_stack_fffffffffffffccc = Configuration::level(local_68);
              in_stack_fffffffffffffcc0 =
                   (TypedConfigurations *)Configuration::value_abi_cxx11_(local_68);
              std::__cxx11::string::begin();
              includeGlobalLevel = extraout_var;
              in_stack_fffffffffffffcb8 = Configuration::value_abi_cxx11_(local_68);
              local_1c9._1_8_ = std::__cxx11::string::end();
              in_stack_fffffffffffffcb0 = (TypedConfigurations *)local_1c9;
              std::allocator<char>::allocator();
              std::__cxx11::string::
              string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                        (in_stack_fffffffffffffc40,in_stack_fffffffffffffc50,
                         in_stack_fffffffffffffc48,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
              LogFormat::LogFormat
                        ((LogFormat *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                         (Level)((ulong)in_stack_fffffffffffffc58 >> 0x20),
                         (string_t *)in_stack_fffffffffffffc50._M_current);
              setValue<el::base::LogFormat>
                        (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                         in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                         (bool)includeGlobalLevel);
              LogFormat::~LogFormat(in_stack_fffffffffffffc20);
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffe48);
              std::allocator<char>::~allocator((allocator<char> *)local_1c9);
            }
            else {
              in_stack_fffffffffffffcac = Configuration::configurationType(local_68);
              if (in_stack_fffffffffffffcac == Warning) {
                in_stack_fffffffffffffca0 = Configuration::value_abi_cxx11_(local_68);
                std::__cxx11::string::string(local_1f8,(string *)in_stack_fffffffffffffca0);
                in_stack_fffffffffffffc98 =
                     (unordered_map<el::Level,_bool,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                      *)getULong((TypedConfigurations *)
                                 CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                 (string *)in_stack_fffffffffffffe50);
                SubsecondPrecision::SubsecondPrecision
                          ((SubsecondPrecision *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc1c
                          );
                setValue<el::base::SubsecondPrecision>
                          (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                           (SubsecondPrecision *)CONCAT44(CVar2,in_stack_fffffffffffffcd0),
                           (unordered_map<el::Level,_el::base::SubsecondPrecision,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
                            *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                           SUB81((ulong)in_stack_fffffffffffffcc0 >> 0x38,0));
                std::__cxx11::string::~string(local_1f8);
              }
              else {
                in_stack_fffffffffffffc94 = Configuration::configurationType(local_68);
                if (in_stack_fffffffffffffc94 == PerformanceTracking) {
                  in_stack_fffffffffffffc88 =
                       (TypedConfigurations *)Configuration::value_abi_cxx11_(local_68);
                  std::__cxx11::string::string(local_220,(string *)in_stack_fffffffffffffc88);
                  local_1f9 = build::anon_class_1_0_00000001::operator()
                                        ((anon_class_1_0_00000001 *)in_stack_fffffffffffffc30,
                                         (string *)
                                         CONCAT44(in_stack_fffffffffffffc2c,
                                                  in_stack_fffffffffffffc28));
                  in_stack_fffffffffffffc84 = CONCAT13(local_1f9,(int3)in_stack_fffffffffffffc84);
                  setValue<bool>(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,
                                 (bool *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,
                                 SUB41(in_stack_fffffffffffffc94 >> 0x18,0));
                  std::__cxx11::string::~string(local_220);
                }
                else {
                  CVar2 = Configuration::configurationType(local_68);
                  if (CVar2 == MaxLogFileSize) {
                    in_stack_fffffffffffffc78 = Configuration::value_abi_cxx11_(local_68);
                    std::__cxx11::string::string(local_248,(string *)in_stack_fffffffffffffc78);
                    uVar5 = getULong((TypedConfigurations *)
                                     CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                                     (string *)in_stack_fffffffffffffe50);
                    std::__cxx11::string::~string(local_248);
                    local_228 = uVar5;
                    Configuration::level(local_68);
                    local_250 = local_228;
                    setValue<unsigned_long>
                              (in_stack_fffffffffffffcc0,
                               (Level)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                               (unsigned_long *)in_stack_fffffffffffffcb0,
                               (unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                                *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                               SUB81((ulong)in_stack_fffffffffffffca0 >> 0x38,0));
                    if (local_228 != 0) {
                      std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::
                      push_back((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *
                                )in_stack_fffffffffffffc30,
                                (value_type *)
                                CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
                    }
                  }
                  else {
                    CVar2 = Configuration::configurationType(local_68);
                    if (CVar2 == LogFlushThreshold) {
                      in_stack_fffffffffffffc64 = Configuration::level(local_68);
                      in_stack_fffffffffffffc58 = Configuration::value_abi_cxx11_(local_68);
                      std::__cxx11::string::string(local_278,(string *)in_stack_fffffffffffffc58);
                      in_stack_fffffffffffffc50._M_current =
                           (char *)getULong((TypedConfigurations *)
                                            CONCAT44(in_stack_fffffffffffffe5c,
                                                     in_stack_fffffffffffffe58),
                                            (string *)in_stack_fffffffffffffe50);
                      local_258 = (string_t *)in_stack_fffffffffffffc50._M_current;
                      setValue<unsigned_long>
                                (in_stack_fffffffffffffcc0,
                                 (Level)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                                 (unsigned_long *)in_stack_fffffffffffffcb0,
                                 (unordered_map<el::Level,_unsigned_long,_std::hash<el::Level>,_std::equal_to<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                                  *)CONCAT44(in_stack_fffffffffffffcac,in_stack_fffffffffffffca8),
                                 SUB81((ulong)in_stack_fffffffffffffca0 >> 0x38,0));
                      std::__cxx11::string::~string(local_278);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ::operator++(local_40);
  }
  local_288._0_8_ = (**(code **)(*local_10 + 0x28))();
  __gnu_cxx::
  __normal_iterator<el::Configuration*const*,std::vector<el::Configuration*,std::allocator<el::Configuration*>>>
  ::__normal_iterator<el::Configuration**>
            ((__normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              *)in_stack_fffffffffffffc20,
             (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  while( true ) {
    local_290 = (**(code **)(*local_10 + 0x30))();
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)in_stack_fffffffffffffc20,
                       (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    if (!bVar1) break;
    ppCVar6 = __gnu_cxx::
              __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ::operator*((__normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                           *)(local_288 + 8));
    local_298 = *ppCVar6;
    CVar2 = Configuration::configurationType(local_298);
    if (CVar2 == Filename) {
      Configuration::level(local_298);
      in_stack_fffffffffffffc30 = Configuration::value_abi_cxx11_(local_298);
      insertFile(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac,in_stack_fffffffffffffca0);
    }
    __gnu_cxx::
    __normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ::operator++((__normal_iterator<el::Configuration_*const_*,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                  *)(local_288 + 8));
  }
  local_2c8._40_8_ =
       std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::begin
                 ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                  CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
  while( true ) {
    local_2c8._32_8_ =
         std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::end
                   ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
                    CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)in_stack_fffffffffffffc20,
                       (__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffffc1c,in_stack_fffffffffffffc18));
    if (!bVar1) break;
    ppCVar7 = __gnu_cxx::
              __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              ::operator*((__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                           *)(local_2c8 + 0x28));
    LVar3 = Configuration::level(*ppCVar7);
    in_stack_fffffffffffffc20 = (LogFormat *)local_2c8;
    std::function<void(char_const*,unsigned_long)>::
    function<void(&)(char_const*,unsigned_long),void>
              ((function<void_(const_char_*,_unsigned_long)> *)in_stack_fffffffffffffc30,
               (_func_void_char_ptr_unsigned_long *)CONCAT44(LVar3,in_stack_fffffffffffffc28));
    unsafeValidateFileRolling
              (in_stack_fffffffffffffc88,in_stack_fffffffffffffc84,
               (PreRollOutCallback *)in_stack_fffffffffffffc78);
    utils::std::function<void_(const_char_*,_unsigned_long)>::~function
              ((function<void_(const_char_*,_unsigned_long)> *)0x22d7da);
    __gnu_cxx::
    __normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ::operator++((__normal_iterator<el::Configuration_**,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                  *)(local_2c8 + 0x28));
  }
  std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>::~vector
            ((vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> *)
             in_stack_fffffffffffffc30);
  threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            (&local_18);
  return;
}

Assistant:

void TypedConfigurations::build(Configurations* configurations) {
  base::threading::ScopedLock scopedLock(lock());
  auto getBool = [] (std::string boolStr) -> bool {  // Pass by value for trimming
    base::utils::Str::trim(boolStr);
    return (boolStr == "TRUE" || boolStr == "true" || boolStr == "1");
  };
  std::vector<Configuration*> withFileSizeLimit;
  for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
    Configuration* conf = *it;
    // We cannot use switch on strong enums because Intel C++ dont support them yet
    if (conf->configurationType() == ConfigurationType::Enabled) {
      setValue(conf->level(), getBool(conf->value()), &m_enabledMap);
    } else if (conf->configurationType() == ConfigurationType::ToFile) {
      setValue(conf->level(), getBool(conf->value()), &m_toFileMap);
    } else if (conf->configurationType() == ConfigurationType::ToStandardOutput) {
      setValue(conf->level(), getBool(conf->value()), &m_toStandardOutputMap);
    } else if (conf->configurationType() == ConfigurationType::Filename) {
      // We do not yet configure filename but we will configure in another
      // loop. This is because if file cannot be created, we will force ToFile
      // to be false. Because configuring logger is not necessarily performance
      // sensative operation, we can live with another loop; (by the way this loop
      // is not very heavy either)
    } else if (conf->configurationType() == ConfigurationType::Format) {
      setValue(conf->level(), base::LogFormat(conf->level(),
                                              base::type::string_t(conf->value().begin(), conf->value().end())), &m_logFormatMap);
    } else if (conf->configurationType() == ConfigurationType::SubsecondPrecision) {
      setValue(Level::Global,
               base::SubsecondPrecision(static_cast<int>(getULong(conf->value()))), &m_subsecondPrecisionMap);
    } else if (conf->configurationType() == ConfigurationType::PerformanceTracking) {
      setValue(Level::Global, getBool(conf->value()), &m_performanceTrackingMap);
    } else if (conf->configurationType() == ConfigurationType::MaxLogFileSize) {
      auto v = getULong(conf->value());
      setValue(conf->level(), static_cast<std::size_t>(v), &m_maxLogFileSizeMap);
      if (v != 0) {
        withFileSizeLimit.push_back(conf);
      }
    } else if (conf->configurationType() == ConfigurationType::LogFlushThreshold) {
      setValue(conf->level(), static_cast<std::size_t>(getULong(conf->value())), &m_logFlushThresholdMap);
    }
  }
  // As mentioned earlier, we will now set filename configuration in separate loop to deal with non-existent files
  for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
    Configuration* conf = *it;
    if (conf->configurationType() == ConfigurationType::Filename) {
      insertFile(conf->level(), conf->value());
    }
  }
  for (std::vector<Configuration*>::iterator conf = withFileSizeLimit.begin();
       conf != withFileSizeLimit.end(); ++conf) {
    // This is not unsafe as mutex is locked in currect scope
    unsafeValidateFileRolling((*conf)->level(), base::defaultPreRollOutCallback);
  }
}